

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int ftp_open_network(char *filename,FILE **ftpfile,FILE **command,int *sock)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  ssize_t sVar7;
  FILE **ppFVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  int port;
  float version;
  int tmpint;
  char ip [100];
  char host [100];
  char agentStr [100];
  char proto [100];
  char tmpstr [1200];
  char recbuf [1200];
  char fn [1200];
  char turl [1200];
  int local_14e4;
  FILE **local_14e0;
  float local_14d4;
  FILE **local_14d0;
  char *local_14c8;
  int local_14bc;
  char local_14b8 [112];
  char local_1448 [112];
  FILE *local_13d8 [14];
  char local_1368 [112];
  char local_12f8 [1200];
  char local_e48;
  char local_e47;
  char local_e46;
  undefined1 local_998 [1200];
  char local_4e8 [1208];
  
  local_14d4 = 0.0;
  sVar4 = strlen(filename);
  if (sVar4 < 0x4aa) {
    builtin_strncpy(local_4e8,"ftp://",7);
    strcat(local_4e8,filename);
    pcVar9 = local_1448;
    iVar1 = NET_ParseUrl(local_4e8,local_1368,pcVar9,&local_14e4,local_998);
    if (iVar1 == 0) {
      local_14e4 = 0x15;
      fVar12 = ffvers(&local_14d4);
      snprintf((char *)local_13d8,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar12);
      pcVar5 = strrchr(pcVar9,0x40);
      local_14e0 = local_13d8;
      local_14d0 = ftpfile;
      if (pcVar5 == (char *)0x0) {
        local_14c8 = "anonymous";
      }
      else {
        *pcVar5 = '\0';
        pcVar9 = pcVar5 + 1;
        local_14c8 = local_1448;
        pcVar5 = strchr(local_14c8,0x3a);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
          local_14e0 = (FILE **)(pcVar5 + 1);
        }
      }
      iVar1 = 0;
      do {
        iVar2 = NET_TcpConnect(pcVar9,local_14e4);
        *sock = iVar2;
        pFVar6 = fdopen(iVar2,"r");
        *command = (FILE *)pFVar6;
        if (pFVar6 == (FILE *)0x0) {
          pcVar9 = "fdopen failed to convert socket to stdio file (ftp_open_netowrk)";
          goto LAB_0013650d;
        }
        iVar2 = ftp_status((FILE *)pFVar6,"220 ");
        if (iVar2 == 0) {
          pcVar9 = local_14c8;
          snprintf(local_12f8,0x4b0,"USER %s\r\n");
          iVar2 = (int)pcVar9;
          iVar1 = *sock;
          sVar4 = strlen(local_12f8);
          NET_SendRaw(iVar1,local_12f8,(int)sVar4,iVar2);
          iVar1 = ftp_status(*command,"331 ");
          if (iVar1 == 0) {
            ppFVar8 = local_14e0;
            snprintf(local_12f8,0x4b0,"PASS %s\r\n");
            iVar1 = *sock;
            sVar4 = strlen(local_12f8);
            NET_SendRaw(iVar1,local_12f8,(int)sVar4,(int)ppFVar8);
            iVar1 = ftp_status(*command,"230 ");
            iVar2 = (int)ppFVar8;
            if (iVar1 != 0) {
              pcVar9 = "PASS error, no 230 seen (ftp_open_network)";
              goto LAB_0013672f;
            }
            pcVar9 = local_998;
            pcVar5 = strrchr(pcVar9,0x2f);
            if (pcVar5 == (char *)0x0) {
              builtin_strncpy(local_12f8,"CWD /\r\n",8);
            }
            else {
              *pcVar5 = '\0';
              pcVar9 = pcVar5 + 1;
              if (local_998[0] == '/') {
                ppFVar8 = (FILE **)(local_998 + 1);
              }
              else {
                if (local_998[0] == '\0') {
                  builtin_strncpy(local_12f8,"CWD /\r\n",8);
                  goto LAB_001367f0;
                }
                ppFVar8 = (FILE **)local_998;
              }
              snprintf(local_12f8,0x4b0,"CWD %s\r\n");
            }
LAB_001367f0:
            iVar1 = *sock;
            sVar4 = strlen(local_12f8);
            NET_SendRaw(iVar1,local_12f8,(int)sVar4,(int)ppFVar8);
            iVar1 = ftp_status(*command,"250 ");
            iVar2 = (int)ppFVar8;
            if (iVar1 == 0) {
              if (*pcVar9 != '\0') {
                builtin_strncpy(local_12f8,"TYPE I\r\n",9);
                iVar1 = *sock;
                sVar4 = strlen(local_12f8);
                NET_SendRaw(iVar1,local_12f8,(int)sVar4,iVar2);
                iVar1 = ftp_status(*command,"200 ");
                if (iVar1 == 0) {
                  NET_SendRaw(*sock,"PASV\r\n",6,iVar2);
                  pcVar5 = fgets(&local_e48,0x4b0,(FILE *)*command);
                  if (pcVar5 == (char *)0x0) {
                    pcVar9 = "PASV error (ftp_open)";
LAB_00136b4a:
                    ffpmsg(pcVar9);
                  }
                  else if (((local_e48 == '2') && (local_e47 == '2')) && (local_e46 == '7')) {
                    pcVar5 = strchr(&local_e48,0x28);
                    if (pcVar5 != (char *)0x0) {
                      ppFVar8 = (FILE **)0x0;
                      *pcVar5 = '\0';
                      local_14b8[0] = '\0';
                      pcVar5 = strtok(pcVar5 + 1,",)");
                      iVar2 = (int)ppFVar8;
                      if (pcVar5 != (char *)0x0) {
                        strcpy(local_14b8,pcVar5);
                        sVar4 = strlen(local_14b8);
                        (local_14b8 + sVar4)[0] = '.';
                        (local_14b8 + sVar4)[1] = '\0';
                        pcVar5 = strtok((char *)0x0,",)");
                        iVar2 = (int)ppFVar8;
                        if (pcVar5 != (char *)0x0) {
                          strcat(local_14b8,pcVar5);
                          sVar4 = strlen(local_14b8);
                          (local_14b8 + sVar4)[0] = '.';
                          (local_14b8 + sVar4)[1] = '\0';
                          pcVar5 = strtok((char *)0x0,",)");
                          if (pcVar5 != (char *)0x0) {
                            strcat(local_14b8,pcVar5);
                            sVar4 = strlen(local_14b8);
                            (local_14b8 + sVar4)[0] = '.';
                            (local_14b8 + sVar4)[1] = '\0';
                            pcVar5 = strtok((char *)0x0,",)");
                            if (pcVar5 != (char *)0x0) {
                              strcat(local_14b8,pcVar5);
                              pcVar5 = strtok((char *)0x0,",)");
                              if (pcVar5 != (char *)0x0) {
                                __isoc99_sscanf(pcVar5,"%d",&local_14e4);
                                local_14e4 = local_14e4 << 8;
                                pcVar5 = strtok((char *)0x0,",)");
                                if (pcVar5 != (char *)0x0) {
                                  __isoc99_sscanf(pcVar5,"%d",&local_14bc);
                                  local_14e4 = local_14e4 + local_14bc;
                                  if (*pcVar9 == '\0') {
                                    pcVar9 = "Null file name (ftp_open_network)";
                                  }
                                  else {
                                    iVar1 = NET_TcpConnect(local_14b8,local_14e4);
                                    pFVar6 = fdopen(iVar1,"r");
                                    *local_14d0 = (FILE *)pFVar6;
                                    if (pFVar6 != (FILE *)0x0) {
                                      snprintf(local_12f8,0x4b0,"RETR %s\r\n");
                                      iVar2 = (int)pcVar9;
                                      iVar3 = *sock;
                                      sVar4 = strlen(local_12f8);
                                      NET_SendRaw(iVar3,local_12f8,(int)sVar4,iVar2);
                                      iVar3 = ftp_status(*command,"150 ");
                                      if (iVar3 == 0) {
                                        return 0;
                                      }
                                      fclose((FILE *)*local_14d0);
                                      NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
                                      fclose((FILE *)*command);
                                      iVar1 = *sock;
                                      goto LAB_00136746;
                                    }
                                    pcVar9 = "Could not connect to passive port (ftp_open_network)";
                                    ppFVar8 = local_14d0;
                                  }
                                  goto LAB_001368a7;
                                }
                              }
                            }
                          }
                          pcVar9 = "PASV error (ftp_open_network)";
                          goto LAB_001368a7;
                        }
                      }
                    }
                    pcVar9 = "PASV error (ftp_open_network)";
                    goto LAB_00136b4a;
                  }
                  pFVar6 = (FILE *)*command;
                }
                else {
                  ffpmsg("TYPE I error, 200 not seen (ftp_open_network)");
                  pFVar6 = (FILE *)*command;
                }
                fclose(pFVar6);
                iVar1 = *sock;
                goto LAB_00136746;
              }
              pcVar9 = "Null file name (ftp_open)";
LAB_001368a7:
              iVar2 = (int)ppFVar8;
              ffpmsg(pcVar9);
              pFVar6 = (FILE *)*command;
            }
            else {
              ffpmsg("CWD error, no 250 seen (ftp_open_network)");
              pFVar6 = (FILE *)*command;
            }
          }
          else {
            pcVar9 = "USER error no 331 seen (ftp_open_network)";
LAB_0013672f:
            ffpmsg(pcVar9);
            pFVar6 = (FILE *)*command;
          }
          fclose(pFVar6);
          iVar1 = *sock;
LAB_00136746:
          NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
          return 0x68;
        }
        fclose((FILE *)*command);
        iVar2 = *sock;
        if (-1 < iVar2) {
          uVar11 = 0;
          do {
            sVar7 = send(iVar2,"QUIT\r\n" + uVar11,(ulong)(6 - (int)uVar11),0);
            if ((int)sVar7 < 1) break;
            uVar10 = (int)uVar11 + (int)sVar7;
            uVar11 = (ulong)uVar10;
          } while ((int)uVar10 < 6);
        }
        sleep(5);
        iVar1 = iVar1 + 1;
      } while (iVar1 != 10);
      pcVar9 = "error connecting to remote server, no 220 seen (ftp_open_network)";
    }
    else {
      pcVar9 = &local_e48;
      snprintf(pcVar9,0x4b0,"URL Parse Error (ftp_open) %s",filename);
    }
  }
  else {
    pcVar9 = "ftp filename is too long (ftp_open_network)";
  }
LAB_0013650d:
  ffpmsg(pcVar9);
  return 0x68;
}

Assistant:

static int ftp_open_network(char *filename, FILE **ftpfile, FILE **command, int *sock)
{
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char agentStr[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii,tryingtologin = 1;
  float version=0.0;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_open_network)");
    return (FILE_NOT_OPENED);
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_open) %s",filename);
    ffpmsg(errorstr);
    return (FILE_NOT_OPENED);
  }
  
  port = 21;
  /* We might have a user name.  If not, set defaults for username and password */
  username = "anonymous";
  snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
  password = agentStr;
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
    /* Connect to the host on the required port */
    *sock = NET_TcpConnect(newhost,port);
    /* convert it to a stdio file */
    if (NULL == (*command = fdopen(*sock,"r"))) {
      ffpmsg ("fdopen failed to convert socket to stdio file (ftp_open_netowrk)");
      return (FILE_NOT_OPENED);
    }

    /* Wait for the 220 response */
    if (ftp_status(*command,"220 ")) {
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);

/*      ffpmsg("sleeping for 5 in ftp_open_network, then try again"); */

      sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

    } else {
      tryingtologin = 0;
      break;
    }
  }

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (FILE_NOT_OPENED);
  }

  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

  if (ftp_status(*command,"331 ")) {
    ffpmsg ("USER error no 331 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }
  
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
 
  status = NET_SendRaw(*sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,*command))) {
    ffpmsg ("PASV error (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV *command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (*ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(*command,"150 ")) {
      fclose(*ftpfile);
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    return 0;    /* successfully opened the ftp file */
  }
  
  /* no passive mode */

  fclose(*command);
  NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
  return (FILE_NOT_OPENED);
}